

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int xmlHashRemoveEntry3(xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3,
                       xmlHashDeallocator dealloc)

{
  long lVar1;
  xmlHashEntry *end;
  uint local_60;
  int found;
  uint nextpos;
  uint pos;
  uint mask;
  uint hashValue;
  xmlHashEntry *next;
  xmlHashEntry *cur;
  xmlHashEntry *entry;
  xmlHashDeallocator dealloc_local;
  xmlChar *key3_local;
  xmlChar *key2_local;
  xmlChar *key_local;
  xmlHashTablePtr hash_local;
  
  if (((hash == (xmlHashTablePtr)0x0) || (hash->size == 0)) || (key == (xmlChar *)0x0)) {
    hash_local._4_4_ = -1;
  }
  else {
    entry = (xmlHashEntry *)dealloc;
    dealloc_local = (xmlHashDeallocator)key3;
    key3_local = key2;
    key2_local = key;
    key_local = (xmlChar *)hash;
    pos = xmlHashValue(hash->randomSeed,key,key2,key3,(size_t *)0x0);
    cur = xmlHashFindEntry((xmlHashTable *)key_local,key2_local,key3_local,(xmlChar *)dealloc_local,
                           pos,(int *)((long)&end + 4));
    if (end._4_4_ == 0) {
      hash_local._4_4_ = -1;
    }
    else {
      if ((entry != (xmlHashEntry *)0x0) && (cur->payload != (void *)0x0)) {
        (*(code *)entry)(cur->payload,cur->key);
      }
      if (*(long *)(key_local + 0x10) == 0) {
        if (cur->key != (xmlChar *)0x0) {
          (*xmlFree)(cur->key);
        }
        if (cur->key2 != (xmlChar *)0x0) {
          (*xmlFree)(cur->key2);
        }
        if (cur->key3 != (xmlChar *)0x0) {
          (*xmlFree)(cur->key3);
        }
      }
      nextpos = *(int *)(key_local + 8) - 1;
      found = (int)(((long)cur - *(long *)key_local) / 0x28);
      next = cur;
      while( true ) {
        local_60 = found + 1;
        _mask = next + 1;
        if ((local_60 & nextpos) == 0) {
          _mask = *(xmlHashEntry **)key_local;
        }
        if ((_mask->hashValue == 0) || ((_mask->hashValue - local_60 & nextpos) == 0)) break;
        next = _mask;
        found = local_60;
      }
      _mask = cur + 1;
      if (next < cur) {
        lVar1 = *(long *)key_local + (ulong)*(uint *)(key_local + 8) * 0x28;
        memmove(cur,_mask,lVar1 - (long)_mask);
        cur = *(xmlHashEntry **)key_local;
        memcpy((void *)(lVar1 + -0x28),cur,0x28);
        _mask = cur + 1;
      }
      memmove(cur,_mask,(long)next - (long)cur);
      next->hashValue = 0;
      *(int *)(key_local + 0xc) = *(int *)(key_local + 0xc) + -1;
      hash_local._4_4_ = 0;
    }
  }
  return hash_local._4_4_;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
int
xmlHashRemoveEntry3(xmlHashTablePtr hash, const xmlChar *key,
                    const xmlChar *key2, const xmlChar *key3,
                    xmlHashDeallocator dealloc) {
    xmlHashEntry *entry, *cur, *next;
    unsigned hashValue, mask, pos, nextpos;
    int found;

    if ((hash == NULL) || (hash->size == 0) || (key == NULL))
        return(-1);

    hashValue = xmlHashValue(hash->randomSeed, key, key2, key3, NULL);
    entry = xmlHashFindEntry(hash, key, key2, key3, hashValue, &found);
    if (!found)
        return(-1);

    if ((dealloc != NULL) && (entry->payload != NULL))
        dealloc(entry->payload, entry->key);
    if (hash->dict == NULL) {
        if (entry->key)
            xmlFree(entry->key);
        if (entry->key2)
            xmlFree(entry->key2);
        if (entry->key3)
            xmlFree(entry->key3);
    }

    /*
     * Find end of probe sequence. Entries at their initial probe
     * position start a new sequence.
     */
    mask = hash->size - 1;
    pos = entry - hash->table;
    cur = entry;

    while (1) {
        nextpos = pos + 1;
        next = cur + 1;
        if ((nextpos & mask) == 0)
            next = hash->table;

        if ((next->hashValue == 0) ||
            (((next->hashValue - nextpos) & mask) == 0))
            break;

        cur = next;
        pos = nextpos;
    }

    /*
     * Backward shift
     */
    next = entry + 1;

    if (cur < entry) {
        xmlHashEntry *end = &hash->table[hash->size];

        memmove(entry, next, (char *) end - (char *) next);
        entry = hash->table;
        end[-1] = *entry;
        next = entry + 1;
    }

    memmove(entry, next, (char *) cur - (char *) entry);

    /*
     * Update entry
     */
    cur->hashValue = 0;

    hash->nbElems--;

    return(0);
}